

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

void re2c::output_yyaccept_init(ostream *o,uint32_t ind,bool used_yyaccept)

{
  ostream *poVar1;
  opt_t *poVar2;
  undefined3 in_register_00000011;
  undefined4 in_register_00000034;
  string local_30;
  
  if (CONCAT31(in_register_00000011,used_yyaccept) != 0) {
    indent_abi_cxx11_(&local_30,(re2c *)CONCAT44(in_register_00000034,ind),
                      CONCAT31(in_register_00000011,used_yyaccept));
    poVar1 = std::operator<<(o,(string *)&local_30);
    poVar1 = std::operator<<(poVar1,"unsigned int ");
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->yyaccept);
    std::operator<<(poVar1," = 0;\n");
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void output_yyaccept_init (std::ostream & o, uint32_t ind, bool used_yyaccept)
{
	if (used_yyaccept)
	{
		o << indent (ind) << "unsigned int " << opts->yyaccept << " = 0;\n";
	}
}